

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O2

unsigned_long
duckdb::BitwiseShiftLeftOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
          (unsigned_long input,unsigned_long shift)

{
  OutOfRangeException *pOVar1;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (shift < 0x41) {
    if (shift != 0) {
      if (input >> (-(byte)shift & 0x3f) != 0) {
        pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_a0,"Overflow in left shift (%s << %s)",&local_a1);
        ::std::__cxx11::to_string(&local_60,input);
        ::std::__cxx11::to_string(&local_80,shift);
        OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                  (pOVar1,&local_a0,&local_60,&local_80);
        __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
      input = input << ((byte)shift & 0x3f);
    }
  }
  else {
    if (input != 0) {
      pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_a0,"Left-shift value %s is out of range",&local_a1);
      ::std::__cxx11::to_string(&local_40,shift);
      OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar1,&local_a0,&local_40);
      __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    input = 0;
  }
  return input;
}

Assistant:

static inline TR Operation(TA input, TB shift) {
		TA max_shift = TA(sizeof(TA) * 8) + (NumericLimits<TA>::IsSigned() ? 0 : 1);
		if (input < 0) {
			throw OutOfRangeException("Cannot left-shift negative number %s", NumericHelper::ToString(input));
		}
		if (shift < 0) {
			throw OutOfRangeException("Cannot left-shift by negative number %s", NumericHelper::ToString(shift));
		}
		if (shift >= max_shift) {
			if (input == 0) {
				return 0;
			}
			throw OutOfRangeException("Left-shift value %s is out of range", NumericHelper::ToString(shift));
		}
		if (shift == 0) {
			return input;
		}
		TA max_value = UnsafeNumericCast<TA>((TA(1) << (max_shift - shift - 1)));
		if (input >= max_value) {
			throw OutOfRangeException("Overflow in left shift (%s << %s)", NumericHelper::ToString(input),
			                          NumericHelper::ToString(shift));
		}
		return UnsafeNumericCast<TR>(input << shift);
	}